

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeTangent
          (ChVector<double> *__return_storage_ptr__,ChElementBeamANCF_3333 *this,double xi)

{
  ChVector<double> *v;
  undefined1 auVar2 [16];
  double dVar1;
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ChVector<double> BeamAxisTangent;
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_160;
  double *local_158;
  ChVector<double> local_150;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  Matrix3xN local_f0;
  
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = xi;
  local_138 = xi + -0.5;
  local_118 = this->m_thicknessY * 0.25 * 0.0;
  auVar2 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar3._0_16_,ZEXT816(0x4000000000000000));
  local_130 = auVar2._0_8_ * local_118;
  local_110 = this->m_thicknessZ * 0.25 * 0.0;
  local_128 = auVar2._0_8_ * local_110;
  local_120 = xi + 0.5;
  auVar2 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar3._0_16_,ZEXT816(0x3ff0000000000000));
  local_118 = auVar2._0_8_ * local_118;
  local_110 = auVar2._0_8_ * local_110;
  local_108 = xi * -2.0;
  local_100 = this->m_thicknessY * -0.0 * xi;
  local_f8 = this->m_thicknessZ * -0.0 * xi;
  CalcCoordMatrix(this,&local_f0);
  local_160 = &local_f0;
  local_158 = &local_138;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            (&local_150,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)&local_160,(type *)0x0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_150.m_data[0];
  __return_storage_ptr__->m_data[0] = local_150.m_data[0];
  __return_storage_ptr__->m_data[1] = local_150.m_data[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_150.m_data[2];
  __return_storage_ptr__->m_data[2] = local_150.m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_150.m_data[1] * local_150.m_data[1];
  auVar2 = vfmadd231sd_fma(auVar2,auVar4,auVar4);
  auVar2 = vfmadd231sd_fma(auVar2,auVar5,auVar5);
  if (auVar2._0_8_ < 0.0) {
    dVar1 = sqrt(auVar2._0_8_);
  }
  else {
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    dVar1 = auVar2._0_8_;
  }
  if (dVar1 < 2.2250738585072014e-308) {
    __return_storage_ptr__->m_data[0] = 1.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    local_150.m_data[2] = 0.0;
  }
  else {
    dVar1 = 1.0 / dVar1;
    __return_storage_ptr__->m_data[0] = local_150.m_data[0] * dVar1;
    __return_storage_ptr__->m_data[1] = local_150.m_data[1] * dVar1;
    local_150.m_data[2] = local_150.m_data[2] * dVar1;
  }
  __return_storage_ptr__->m_data[2] = local_150.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementBeamANCF_3333::ComputeTangent(const double xi) {
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // partial derivative of the position vector with respect to xi (normalized coordinate along the beam axis).  In
    // general, this will not be a unit vector
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact;

    return BeamAxisTangent.GetNormalized();
}